

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  bool bVar1;
  int iVar2;
  secp256k1_modinv64_modinfo *psVar3;
  ulong uVar4;
  int64_t iVar5;
  int64_t iVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  secp256k1_modinv64_signed62 *psVar11;
  ulong uVar12;
  secp256k1_modinv64_signed62 *psVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong *extraout_RDX;
  long lVar17;
  long lVar18;
  secp256k1_modinv64_signed62 *a;
  long *extraout_RDX_00;
  long lVar19;
  long lVar20;
  secp256k1_modinv64_signed62 *b;
  int iVar21;
  int64_t *piVar22;
  secp256k1_modinv64_signed62 *psVar23;
  secp256k1_modinv64_signed62 *psVar24;
  long lVar25;
  int64_t *unaff_RBP;
  int64_t *a_00;
  ulong uVar26;
  int64_t *a_01;
  int64_t *piVar27;
  secp256k1_modinv64_modinfo *psVar28;
  ulong uVar29;
  long lVar30;
  int64_t *piVar31;
  long lVar32;
  int64_t *piVar33;
  int64_t *piVar34;
  long lVar35;
  long lVar36;
  secp256k1_modinv64_modinfo *psVar37;
  secp256k1_modinv64_modinfo *modinfo_00;
  long lVar38;
  int64_t *piVar39;
  long lVar40;
  int64_t *piVar41;
  bool bVar42;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 e;
  secp256k1_modinv64_signed62 sStack_250;
  secp256k1_modinv64_signed62 sStack_228;
  secp256k1_modinv64_signed62 *psStack_200;
  int64_t *piStack_1f8;
  int64_t *piStack_1f0;
  ulong uStack_1e8;
  int64_t *piStack_1e0;
  ulong uStack_1d8;
  int64_t *piStack_1d0;
  secp256k1_modinv64_signed62 *psStack_1c8;
  long lStack_1c0;
  int64_t *piStack_1b8;
  int64_t *piStack_1b0;
  secp256k1_modinv64_signed62 *psStack_1a8;
  long lStack_1a0;
  secp256k1_modinv64_signed62 *psStack_198;
  secp256k1_modinv64_signed62 *psStack_190;
  secp256k1_modinv64_signed62 *psStack_188;
  secp256k1_modinv64_signed62 *psStack_180;
  long lStack_178;
  int64_t *piStack_170;
  int64_t *piStack_168;
  int64_t *piStack_160;
  secp256k1_modinv64_modinfo *psStack_158;
  int64_t *piStack_150;
  int64_t *piStack_148;
  long lStack_140;
  int64_t *piStack_138;
  int64_t *piStack_130;
  ulong uStack_128;
  uint local_11c;
  secp256k1_modinv64_signed62 local_118;
  int64_t *local_f0;
  secp256k1_modinv64_modinfo *local_e8;
  int64_t *local_e0 [2];
  ulong auStack_d0 [5];
  secp256k1_modinv64_trans2x2 local_a8;
  secp256k1_modinv64_signed62 local_88;
  secp256k1_modinv64_signed62 local_58;
  
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  piVar41 = (int64_t *)0x0;
  local_88.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[4] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[0] = 1;
  local_118.v[4] = (modinfo->modulus).v[4];
  local_118.v[0] = (modinfo->modulus).v[0];
  local_118.v[1] = (modinfo->modulus).v[1];
  local_118.v[2] = (modinfo->modulus).v[2];
  local_118.v[3] = (modinfo->modulus).v[3];
  auStack_d0[3] = x->v[4];
  local_e0[1] = (int64_t *)x->v[0];
  auStack_d0[0] = x->v[1];
  auStack_d0[1] = x->v[2];
  auStack_d0[2] = x->v[3];
  lVar40 = -1;
  piVar22 = (int64_t *)0x5;
  local_f0 = x->v;
  local_e8 = modinfo;
  do {
    modinfo_00 = local_e8;
    piVar27 = (int64_t *)local_118.v[0];
    local_11c = (uint)piVar22;
    psVar3 = (secp256k1_modinv64_modinfo *)0x0;
    piVar31 = (int64_t *)0x0;
    psVar28 = (secp256k1_modinv64_modinfo *)0x1;
    uVar15 = 0x3e;
    a_00 = (int64_t *)0x1;
    piVar34 = local_e0[1];
    piVar39 = (int64_t *)local_118.v[0];
    while( true ) {
      a_01 = (int64_t *)(-1L << ((byte)uVar15 & 0x3f) | (ulong)piVar34);
      psVar11 = (secp256k1_modinv64_signed62 *)0x0;
      if (a_01 != (int64_t *)0x0) {
        for (; ((ulong)a_01 >> (long)psVar11 & 1) == 0;
            psVar11 = (secp256k1_modinv64_signed62 *)((long)psVar11->v + 1)) {
        }
      }
      bVar8 = (byte)psVar11;
      piVar33 = (int64_t *)((ulong)piVar34 >> (bVar8 & 0x3f));
      a_00 = (int64_t *)((long)a_00 << (bVar8 & 0x3f));
      psVar3 = (secp256k1_modinv64_modinfo *)((long)psVar3 << (bVar8 & 0x3f));
      lVar40 = lVar40 - (long)psVar11;
      uVar15 = uVar15 - (int)psVar11;
      local_e0[0] = piVar41;
      if (uVar15 == 0) break;
      if (((ulong)piVar39 & 1) == 0) {
        piStack_130 = (int64_t *)0x146910;
        secp256k1_modinv64_var_cold_8();
LAB_00146910:
        piStack_130 = (int64_t *)0x146915;
        secp256k1_modinv64_var_cold_7();
LAB_00146915:
        piStack_130 = (int64_t *)0x14691a;
        secp256k1_modinv64_var_cold_1();
LAB_0014691a:
        piStack_130 = (int64_t *)0x14691f;
        secp256k1_modinv64_var_cold_2();
LAB_0014691f:
        piStack_130 = (int64_t *)0x146924;
        secp256k1_modinv64_var_cold_6();
        piVar33 = piVar39;
        goto LAB_00146924;
      }
      if (((ulong)piVar33 & 1) == 0) goto LAB_00146910;
      a_01 = (int64_t *)((long)psVar3 * (long)local_e0[1] + (long)a_00 * local_118.v[0]);
      psVar11 = (secp256k1_modinv64_signed62 *)(ulong)(0x3e - uVar15);
      bVar8 = (byte)(0x3e - uVar15);
      piVar22 = (int64_t *)((long)piVar39 << (bVar8 & 0x3f));
      if (a_01 != piVar22) goto LAB_00146915;
      piVar22 = (int64_t *)((long)psVar28 * (long)local_e0[1] + (long)piVar31 * local_118.v[0]);
      a_01 = (int64_t *)((long)piVar33 << (bVar8 & 0x3f));
      if (piVar22 != a_01) goto LAB_0014691a;
      psVar11 = (secp256k1_modinv64_signed62 *)(lVar40 - 0x2ea);
      if (psVar11 < (secp256k1_modinv64_signed62 *)0xfffffffffffffa2d) goto LAB_0014691f;
      iVar2 = (int)piVar33;
      if (lVar40 < 0) {
        lVar40 = -lVar40;
        uVar9 = (int)lVar40 + 1;
        if ((int)uVar15 <= (int)uVar9) {
          uVar9 = uVar15;
        }
        psVar11 = (secp256k1_modinv64_signed62 *)(ulong)uVar9;
        a_01 = (int64_t *)(ulong)(uVar9 - 0x3f);
        if (0xffffffc1 < uVar9 - 0x3f) {
          psVar37 = (secp256k1_modinv64_modinfo *)-(long)psVar3;
          unaff_RBP = (int64_t *)-(long)a_00;
          piVar34 = (int64_t *)-(long)piVar39;
          piVar22 = (int64_t *)((ulong)(0x3fL << (-(char)uVar9 & 0x3fU)) >> (-(char)uVar9 & 0x3fU));
          uVar9 = (iVar2 * iVar2 + 0x3e) * iVar2 * (int)piVar34 & (uint)piVar22;
          psVar3 = psVar28;
          a_00 = piVar31;
          modinfo = psVar37;
          goto LAB_001465cd;
        }
        goto LAB_0014692e;
      }
      uVar9 = (int)lVar40 + 1;
      if ((int)uVar15 <= (int)uVar9) {
        uVar9 = uVar15;
      }
      psVar11 = (secp256k1_modinv64_signed62 *)(ulong)uVar9;
      a_01 = (int64_t *)(ulong)(uVar9 - 0x3f);
      if (uVar9 - 0x3f < 0xffffffc2) goto LAB_00146929;
      piVar22 = (int64_t *)((ulong)(0xfL << (-(char)uVar9 & 0x3fU)) >> (-(char)uVar9 & 0x3fU));
      uVar9 = -(iVar2 * (((int)piVar39 * 2 + 2U & 8) + (int)piVar39)) & (uint)piVar22;
      unaff_RBP = piVar31;
      psVar37 = psVar28;
      piVar34 = piVar33;
      piVar33 = piVar39;
LAB_001465cd:
      uVar12 = (ulong)uVar9;
      a_01 = (int64_t *)(uVar12 * (long)piVar33);
      piVar34 = (int64_t *)((long)piVar34 + (long)a_01);
      piVar31 = (int64_t *)((long)a_00 * uVar12 + (long)unaff_RBP);
      psVar11 = (secp256k1_modinv64_signed62 *)(uVar12 * (long)psVar3);
      psVar28 = (secp256k1_modinv64_modinfo *)((long)psVar11->v + (long)&psVar37->modulus);
      piVar39 = piVar33;
      if (((ulong)piVar34 & (ulong)piVar22) != 0) {
LAB_00146924:
        piStack_130 = (int64_t *)0x146929;
        secp256k1_modinv64_var_cold_4();
        piVar39 = piVar33;
LAB_00146929:
        piStack_130 = (int64_t *)0x14692e;
        secp256k1_modinv64_var_cold_3();
LAB_0014692e:
        piStack_130 = (int64_t *)0x146933;
        secp256k1_modinv64_var_cold_5();
        goto LAB_00146933;
      }
    }
    a_01 = (int64_t *)((long)psVar3 * (long)piVar31);
    psVar11 = SUB168(SEXT816((long)psVar3) * SEXT816((long)piVar31),8);
    local_a8.u = (int64_t)a_00;
    local_a8.v = (int64_t)psVar3;
    local_a8.q = (int64_t)piVar31;
    local_a8.r = (int64_t)psVar28;
    if ((long)a_00 * (long)psVar28 - (long)a_01 != 0x4000000000000000 ||
        SUB168(SEXT816((long)a_00) * SEXT816((long)psVar28),8) - (long)psVar11 !=
        (ulong)((secp256k1_modinv64_signed62 *)((long)a_00 * (long)psVar28) < a_01)) {
LAB_00146933:
      piStack_130 = (int64_t *)0x146938;
      secp256k1_modinv64_var_cold_9();
      modinfo_00 = modinfo;
LAB_00146938:
      piStack_130 = (int64_t *)0x14693d;
      secp256k1_modinv64_var_cold_20();
LAB_0014693d:
      piStack_130 = (int64_t *)0x146942;
      secp256k1_modinv64_var_cold_19();
LAB_00146942:
      piStack_130 = (int64_t *)0x146947;
      secp256k1_modinv64_var_cold_18();
      piVar41 = piVar27;
LAB_00146947:
      piStack_130 = (int64_t *)0x14694c;
      secp256k1_modinv64_var_cold_17();
LAB_0014694c:
      piStack_130 = (int64_t *)0x146951;
      secp256k1_modinv64_var_cold_14();
LAB_00146951:
      piStack_130 = (int64_t *)0x146956;
      secp256k1_modinv64_var_cold_13();
LAB_00146956:
      piStack_130 = (int64_t *)0x14695b;
      secp256k1_modinv64_var_cold_12();
LAB_0014695b:
      piStack_130 = (int64_t *)0x146960;
      secp256k1_modinv64_var_cold_11();
LAB_00146960:
      piStack_130 = (int64_t *)0x146965;
      secp256k1_modinv64_var_cold_10();
      goto LAB_00146965;
    }
    piStack_130 = (int64_t *)0x14665b;
    secp256k1_modinv64_update_de_62(&local_88,&local_58,&local_a8,local_e8);
    uVar15 = local_11c;
    piVar39 = local_118.v;
    piVar22 = (int64_t *)(ulong)local_11c;
    a_00 = (int64_t *)(ulong)local_11c;
    psVar11 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    piStack_130 = (int64_t *)0x146678;
    a_01 = piVar39;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar39,local_11c,&modinfo_00->modulus,-1);
    if (iVar2 < 1) goto LAB_00146938;
    psVar11 = (secp256k1_modinv64_signed62 *)0x1;
    a_00 = (int64_t *)(ulong)uVar15;
    piStack_130 = (int64_t *)0x146692;
    a_01 = piVar39;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar39,uVar15,&modinfo_00->modulus,1);
    if (0 < iVar2) goto LAB_0014693d;
    piVar27 = (int64_t *)(local_e0 + 1);
    a_00 = (int64_t *)(ulong)uVar15;
    psVar11 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    piStack_130 = (int64_t *)0x1466b3;
    a_01 = piVar27;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar27,uVar15,&modinfo_00->modulus,-1);
    if (iVar2 < 1) goto LAB_00146942;
    psVar11 = (secp256k1_modinv64_signed62 *)0x1;
    a_00 = (int64_t *)(ulong)uVar15;
    piStack_130 = (int64_t *)0x1466cd;
    a_01 = piVar27;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar27,uVar15,&modinfo_00->modulus,1);
    piVar41 = piVar27;
    if (-1 < iVar2) goto LAB_00146947;
    piStack_130 = (int64_t *)0x1466ea;
    secp256k1_modinv64_update_fg_62_var
              (uVar15,(secp256k1_modinv64_signed62 *)piVar39,(secp256k1_modinv64_signed62 *)piVar27,
               &local_a8);
    piVar41 = local_e0[0];
    if (local_e0[1] != (int64_t *)0x0) {
LAB_001466fb:
      lVar14 = (long)(int)uVar15;
      uVar12 = *(ulong *)(&stack0xfffffffffffffee0 + lVar14 * 8);
      psVar11 = (secp256k1_modinv64_signed62 *)local_e0[lVar14];
      a_01 = (int64_t *)((long)uVar12 >> 0x3f ^ uVar12 | lVar14 + -2 >> 0x3f);
      a_00 = (int64_t *)((long)psVar11 >> 0x3f ^ (ulong)psVar11 | (ulong)a_01);
      if (a_00 == (int64_t *)0x0) {
        piVar22 = (int64_t *)(ulong)(uVar15 - 1);
        (&uStack_128)[lVar14] = (&uStack_128)[lVar14] | uVar12 << 0x3e;
        psVar11 = (secp256k1_modinv64_signed62 *)((long)psVar11 << 0x3e);
        (&local_e8)[lVar14] =
             (secp256k1_modinv64_modinfo *)((ulong)(&local_e8)[lVar14] | (ulong)psVar11);
      }
      if (10 < (int)piVar41) goto LAB_0014694c;
      psVar11 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
      piStack_130 = (int64_t *)0x14675d;
      iVar21 = (int)piVar22;
      a_00 = piVar22;
      a_01 = piVar39;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar39,iVar21,&modinfo_00->modulus,-1);
      if (iVar2 < 1) goto LAB_00146951;
      psVar11 = (secp256k1_modinv64_signed62 *)0x1;
      piStack_130 = (int64_t *)0x146777;
      a_00 = piVar22;
      a_01 = piVar39;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar39,iVar21,&modinfo_00->modulus,1);
      if (0 < iVar2) goto LAB_00146956;
      piVar39 = (int64_t *)(local_e0 + 1);
      psVar11 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
      piStack_130 = (int64_t *)0x146798;
      a_00 = piVar22;
      a_01 = piVar39;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar39,iVar21,&modinfo_00->modulus,-1);
      if (iVar2 < 1) goto LAB_0014695b;
      psVar11 = (secp256k1_modinv64_signed62 *)0x1;
      piStack_130 = (int64_t *)0x1467b2;
      a_00 = piVar22;
      a_01 = piVar39;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar39,iVar21,&modinfo_00->modulus,1);
      if (iVar2 < 0) {
        bVar42 = true;
        piVar41 = (int64_t *)(ulong)((int)piVar41 + 1);
        goto LAB_001467e7;
      }
      goto LAB_00146960;
    }
    if (1 < (int)uVar15) {
      uVar12 = 1;
      uVar26 = 0;
      do {
        uVar26 = uVar26 | auStack_d0[uVar12 - 1];
        uVar12 = uVar12 + 1;
      } while (uVar15 != uVar12);
      if (uVar26 != 0) goto LAB_001466fb;
    }
    bVar42 = false;
LAB_001467e7:
    modinfo = modinfo_00;
  } while (bVar42);
  a_01 = (int64_t *)(local_e0 + 1);
  iVar21 = (int)piVar22;
  psVar11 = (secp256k1_modinv64_signed62 *)0x0;
  piStack_130 = (int64_t *)0x146804;
  a_00 = piVar22;
  iVar2 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_01,iVar21,&SECP256K1_SIGNED62_ONE,0);
  if (iVar2 == 0) {
    piStack_130 = (int64_t *)0x146826;
    iVar2 = secp256k1_modinv64_mul_cmp_62(&local_118,iVar21,&SECP256K1_SIGNED62_ONE,-1);
    piVar41 = local_f0;
    if (iVar2 == 0) {
LAB_001468c6:
      piStack_130 = (int64_t *)0x1468e1;
      secp256k1_modinv64_normalize_62
                (&local_88,*(int64_t *)(&stack0xfffffffffffffee0 + (long)iVar21 * 8),modinfo_00);
      piVar41[4] = local_88.v[4];
      piVar41[2] = local_88.v[2];
      piVar41[3] = local_88.v[3];
      *piVar41 = local_88.v[0];
      piVar41[1] = local_88.v[1];
      return;
    }
    piStack_130 = (int64_t *)0x14684b;
    iVar2 = secp256k1_modinv64_mul_cmp_62(&local_118,iVar21,&SECP256K1_SIGNED62_ONE,1);
    if (iVar2 == 0) goto LAB_001468c6;
    a_00 = (int64_t *)0x5;
    psVar11 = (secp256k1_modinv64_signed62 *)0x0;
    piStack_130 = (int64_t *)0x146865;
    a_01 = piVar41;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar41,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar2 == 0) {
      a_01 = local_88.v;
      a_00 = (int64_t *)0x5;
      psVar11 = (secp256k1_modinv64_signed62 *)0x0;
      piStack_130 = (int64_t *)0x146888;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar2 == 0) {
        piStack_130 = (int64_t *)0x1468a4;
        iVar2 = secp256k1_modinv64_mul_cmp_62(&local_118,iVar21,&modinfo_00->modulus,1);
        if (iVar2 == 0) goto LAB_001468c6;
        a_01 = local_118.v;
        psVar11 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
        piStack_130 = (int64_t *)0x1468be;
        a_00 = piVar22;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_01,iVar21,&modinfo_00->modulus,-1);
        if (iVar2 == 0) goto LAB_001468c6;
      }
    }
  }
  else {
LAB_00146965:
    piStack_130 = (int64_t *)0x14696a;
    secp256k1_modinv64_var_cold_15();
  }
  piStack_130 = (int64_t *)secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_16();
  piStack_130 = piVar22;
  if ((ulong)*a_00 >> 0x3e == 0) {
    uVar12 = a_00[1];
    if (0x3fffffffffffffff < uVar12) goto LAB_00146a68;
    uVar26 = a_00[2];
    if (0x3fffffffffffffff < uVar26) goto LAB_00146a6d;
    uVar7 = a_00[3];
    if (0x3fffffffffffffff < uVar7) goto LAB_00146a72;
    psVar11 = (secp256k1_modinv64_signed62 *)a_00[4];
    if ((secp256k1_modinv64_signed62 *)0xff < psVar11) goto LAB_00146a77;
    uVar4 = uVar12 << 0x3e | *a_00;
    uVar16 = uVar26 << 0x3c | uVar12 >> 2;
    uVar26 = uVar7 << 0x3a | uVar26 >> 4;
    uVar12 = (long)psVar11 << 0x38 | uVar7 >> 6;
    *a_01 = uVar4;
    a_01[1] = uVar16;
    a_01[2] = uVar26;
    a_01[3] = uVar12;
    uVar15 = (uint)((0xfffffffffffffffd < uVar26 && uVar12 == 0xffffffffffffffff) &&
                   0xbaaedce6af48a03a < uVar16);
    uVar9 = 0;
    if (0xbaaedce6af48a03b < uVar16) {
      uVar9 = uVar15;
    }
    uVar9 = uVar9 | (uVar26 == 0xffffffffffffffff && uVar12 == 0xffffffffffffffff);
    a_00 = (int64_t *)(ulong)uVar9;
    a_01 = (int64_t *)0xbfd25e8cd0364140;
    uVar10 = 0;
    if (0xbfd25e8cd0364140 < uVar4) {
      uVar10 = uVar15;
    }
    uVar10 = uVar10 | uVar9;
    psVar11 = (secp256k1_modinv64_signed62 *)(ulong)uVar10;
    piVar22 = (int64_t *)CONCAT71((int7)((ulong)piVar22 >> 8),0xbaaedce6af48a03a < uVar16);
    if (uVar10 == 0) {
      return;
    }
  }
  else {
    piStack_138 = (int64_t *)0x146a68;
    secp256k1_scalar_from_signed62_cold_6();
LAB_00146a68:
    piStack_138 = (int64_t *)0x146a6d;
    secp256k1_scalar_from_signed62_cold_5();
LAB_00146a6d:
    piStack_138 = (int64_t *)0x146a72;
    secp256k1_scalar_from_signed62_cold_4();
LAB_00146a72:
    piStack_138 = (int64_t *)0x146a77;
    secp256k1_scalar_from_signed62_cold_3();
LAB_00146a77:
    piStack_138 = (int64_t *)0x146a7c;
    secp256k1_scalar_from_signed62_cold_2();
  }
  piStack_138 = (int64_t *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  piStack_138 = unaff_RBP;
  lStack_140 = lVar40;
  piStack_148 = piVar41;
  piStack_150 = piVar39;
  psStack_158 = modinfo_00;
  piStack_160 = piVar22;
  lVar40 = *a_01;
  piStack_170 = (int64_t *)a_01[1];
  psStack_180 = (secp256k1_modinv64_signed62 *)a_01[2];
  lStack_1a0 = a_01[3];
  psStack_190 = (secp256k1_modinv64_signed62 *)a_01[4];
  piVar41 = (int64_t *)*a_00;
  piStack_168 = (int64_t *)a_00[1];
  lStack_178 = a_00[2];
  uStack_1d8 = *extraout_RDX;
  piStack_1d0 = (int64_t *)extraout_RDX[1];
  uStack_1e8 = extraout_RDX[2];
  piStack_1e0 = (int64_t *)extraout_RDX[3];
  psVar23 = (secp256k1_modinv64_signed62 *)a_00[3];
  psStack_198 = (secp256k1_modinv64_signed62 *)a_00[4];
  piVar22 = (int64_t *)0x5;
  psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  piStack_1f0 = (int64_t *)0x146b1d;
  piVar27 = a_01;
  iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar11,-2);
  if (iVar2 < 1) {
    piStack_1f0 = (int64_t *)0x14763d;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014763d:
    piStack_1f0 = (int64_t *)0x147642;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_00147642:
    piStack_1f0 = (int64_t *)0x147647;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_00147647:
    piStack_1f0 = (int64_t *)0x14764c;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014764c:
    piStack_1f0 = (int64_t *)0x147651;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_00147651:
    piStack_1f0 = (int64_t *)0x147656;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_00147656:
    piStack_1f0 = (int64_t *)0x14765b;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0014765b:
    piStack_1f0 = (int64_t *)0x147660;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar23 = psVar11;
LAB_00147660:
    piStack_1f0 = (int64_t *)0x147665;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00147665:
    piStack_1f0 = (int64_t *)0x14766a;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0014766a:
    piStack_1f0 = (int64_t *)0x14766f;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar24 = psVar23;
LAB_0014766f:
    piStack_1f0 = (int64_t *)0x147674;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00147674:
    piStack_1f0 = (int64_t *)0x147679;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00147679:
    piStack_1f0 = (int64_t *)0x14767e;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0014767e:
    piStack_1f0 = (int64_t *)0x147683;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00147683:
    piStack_1f0 = (int64_t *)0x147688;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00147688:
    piStack_1f0 = (int64_t *)0x14768d;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_0014768d:
    piStack_1f0 = (int64_t *)0x147692;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_00147692:
    piStack_1f0 = (int64_t *)0x147697;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_00147697:
    piStack_1f0 = (int64_t *)0x14769c;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_0014769c:
    piStack_1f0 = (int64_t *)0x1476a1;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_001476a1:
    piVar39 = piVar41;
    a_00 = a_01;
    piStack_1f0 = (int64_t *)0x1476a6;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_001476a6:
    piStack_1f0 = (int64_t *)0x1476ab;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_001476ab:
    piStack_1f0 = (int64_t *)0x1476b0;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_001476b0:
    piStack_1f0 = (int64_t *)0x1476b5;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_001476b5:
    piStack_1f0 = (int64_t *)0x1476ba;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_001476ba:
    piStack_1f0 = (int64_t *)0x1476bf;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_001476bf:
    piStack_1f0 = (int64_t *)0x1476c4;
    secp256k1_modinv64_update_de_62_cold_23();
    a_01 = a_00;
    piVar34 = piVar39;
LAB_001476c4:
    piStack_1f0 = (int64_t *)0x1476c9;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_001476c9:
    piStack_1f0 = (int64_t *)0x1476ce;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_001476ce:
    piStack_1f0 = (int64_t *)0x1476d3;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_001476d3:
    psVar23 = psVar13;
    piStack_1f0 = (int64_t *)0x1476d8;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_001476d8:
    uVar15 = (uint)piVar22;
    piStack_1f0 = (int64_t *)0x1476dd;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar13 = (secp256k1_modinv64_signed62 *)0x1;
    piVar22 = (int64_t *)0x5;
    piStack_1f0 = (int64_t *)0x146b3a;
    piVar27 = a_01;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar11,1);
    if (-1 < iVar2) goto LAB_0014763d;
    piVar22 = (int64_t *)0x5;
    psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    piStack_1f0 = (int64_t *)0x146b59;
    piVar27 = a_00;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,psVar11,-2);
    if (iVar2 < 1) goto LAB_00147642;
    psVar13 = (secp256k1_modinv64_signed62 *)0x1;
    piVar22 = (int64_t *)0x5;
    piStack_1f0 = (int64_t *)0x146b76;
    piVar27 = a_00;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,psVar11,1);
    if (-1 < iVar2) goto LAB_00147647;
    piStack_1f0 = (int64_t *)0x146b9c;
    piStack_1b0 = a_01;
    psStack_188 = psVar23;
    iVar5 = secp256k1_modinv64_abs(uStack_1d8);
    piStack_1f0 = (int64_t *)0x146ba9;
    piVar27 = piStack_1d0;
    iVar6 = secp256k1_modinv64_abs((int64_t)piStack_1d0);
    psVar13 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar6);
    a_01 = (int64_t *)0x3fffffffffffffff;
    if ((long)psVar13 < iVar5) goto LAB_0014764c;
    piStack_1f0 = (int64_t *)0x146bc4;
    iVar5 = secp256k1_modinv64_abs(uStack_1e8);
    piStack_1f0 = (int64_t *)0x146bd1;
    piVar27 = piStack_1e0;
    iVar6 = secp256k1_modinv64_abs((int64_t)piStack_1e0);
    piVar39 = piStack_1b0;
    psVar13 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar6);
    if ((long)psVar13 < iVar5) goto LAB_00147651;
    a_01 = (int64_t *)0x7fffffffffffffff;
    piVar22 = (int64_t *)(uStack_1d8 * lVar40);
    psVar13 = SUB168(SEXT816((long)uStack_1d8) * SEXT816(lVar40),8);
    uVar12 = (long)piStack_1d0 * (long)piVar41;
    lVar17 = SUB168(SEXT816((long)piStack_1d0) * SEXT816((long)piVar41),8);
    lVar14 = (0x7fffffffffffffff - lVar17) - (long)psVar13;
    if (-1 < lVar17 &&
        (SBORROW8(0x7fffffffffffffff - lVar17,(long)psVar13) !=
        SBORROW8(lVar14,(ulong)((undefined1 *)~uVar12 < piVar22))) !=
        (long)(lVar14 - (ulong)((undefined1 *)~uVar12 < piVar22)) < 0) goto LAB_00147656;
    piVar34 = (int64_t *)(uVar12 + (long)piVar22);
    lVar32 = (long)psVar13->v + (ulong)CARRY8(uVar12,(ulong)piVar22) + lVar17;
    uVar26 = uStack_1e8 * lVar40;
    lVar17 = SUB168(SEXT816((long)uStack_1e8) * SEXT816(lVar40),8);
    uVar7 = (long)piStack_1e0 * (long)piVar41;
    lVar18 = SUB168(SEXT816((long)piStack_1e0) * SEXT816((long)piVar41),8);
    uVar12 = (ulong)(-uVar7 - 1 < uVar26);
    lVar40 = (0x7fffffffffffffff - lVar18) - lVar17;
    lVar14 = lVar40 - uVar12;
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar18,lVar17) != SBORROW8(lVar40,uVar12)) == lVar14 < 0
    ;
    psVar13 = (secp256k1_modinv64_signed62 *)
              CONCAT71((int7)((ulong)lVar14 >> 8),lVar18 < 0 || bVar42);
    if (lVar18 >= 0 && !bVar42) goto LAB_0014765b;
    psVar23 = (secp256k1_modinv64_signed62 *)((long)psStack_198 >> 0x3f);
    lStack_1c0 = ((ulong)piStack_1d0 & (ulong)psVar23) + (uStack_1d8 & (long)psStack_190 >> 0x3f);
    uVar4 = uVar7 + uVar26;
    piVar27 = (int64_t *)(lVar18 + lVar17 + (ulong)CARRY8(uVar7,uVar26));
    lVar40 = psVar11->v[0];
    piVar22 = (int64_t *)psVar11[1].v[0];
    psVar13 = (secp256k1_modinv64_signed62 *)0x3fffffffffffffff;
    lStack_1c0 = lStack_1c0 - ((long)piVar22 * (long)piVar34 + lStack_1c0 & 0x3fffffffffffffffU);
    uVar26 = lStack_1c0 * lVar40;
    lVar17 = SUB168(SEXT816(lStack_1c0) * SEXT816(lVar40),8);
    uVar12 = (ulong)((undefined1 *)(-uVar26 - 1) < piVar34);
    lVar14 = (0x7fffffffffffffff - lVar17) - lVar32;
    piVar41 = (int64_t *)((-0x8000000000000000 - lVar17) - (ulong)(uVar26 != 0));
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar17,lVar32) != SBORROW8(lVar14,uVar12)) ==
             (long)(lVar14 - uVar12) < 0;
    if (lVar17 < 0) {
      bVar42 = (SBORROW8(lVar32,(long)piVar41) !=
               SBORROW8(lVar32 - (long)piVar41,(ulong)(piVar34 < (undefined1 *)-uVar26))) ==
               (long)((lVar32 - (long)piVar41) - (ulong)(piVar34 < (undefined1 *)-uVar26)) < 0;
    }
    piStack_1b8 = a_00;
    psStack_1a8 = psVar11;
    if (!bVar42) goto LAB_00147660;
    lVar14 = ((ulong)psVar23 & (ulong)piStack_1e0) + ((long)psStack_190 >> 0x3f & uStack_1e8);
    psVar23 = (secp256k1_modinv64_signed62 *)
              (lVar14 - ((long)piVar22 * uVar4 + lVar14 & 0x3fffffffffffffff));
    lVar17 = lVar17 + lVar32 + (ulong)CARRY8(uVar26,(ulong)piVar34);
    uVar7 = (long)psVar23 * lVar40;
    lVar14 = SUB168(SEXT816((long)psVar23) * SEXT816(lVar40),8);
    uVar12 = (ulong)(-uVar7 - 1 < uVar4);
    lVar40 = (0x7fffffffffffffff - lVar14) - (long)piVar27;
    piVar22 = (int64_t *)((-0x8000000000000000 - lVar14) - (ulong)(uVar7 != 0));
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)piVar27) != SBORROW8(lVar40,uVar12)) ==
             (long)(lVar40 - uVar12) < 0;
    if (lVar14 < 0) {
      bVar42 = (SBORROW8((long)piVar27,(long)piVar22) !=
               SBORROW8((long)piVar27 - (long)piVar22,(ulong)(uVar4 < -uVar7))) ==
               (long)(((long)piVar27 - (long)piVar22) - (ulong)(uVar4 < -uVar7)) < 0;
    }
    if (!bVar42) goto LAB_00147665;
    lVar40 = (long)piVar27 + (ulong)CARRY8(uVar7,uVar4) + lVar14;
    if ((uVar26 + (long)piVar34 & 0x3fffffffffffffff) != 0) goto LAB_0014766a;
    psVar24 = psVar23;
    if ((uVar7 + uVar4 & 0x3fffffffffffffff) != 0) goto LAB_0014766f;
    psVar24 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar12 = (ulong)(uVar26 + (long)piVar34) >> 0x3e | lVar17 * 4;
    psVar13 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar16 = uStack_1d8 * (long)piStack_170 + uVar12;
    piVar27 = (int64_t *)
              (SUB168(SEXT816((long)uStack_1d8) * SEXT816((long)piStack_170),8) + (lVar17 >> 0x3e) +
              (ulong)CARRY8(uStack_1d8 * (long)piStack_170,uVar12));
    uVar26 = (long)piStack_1d0 * (long)piStack_168;
    lVar18 = SUB168(SEXT816((long)piStack_1d0) * SEXT816((long)piStack_168),8);
    uVar12 = (ulong)(-uVar26 - 1 < uVar16);
    lVar14 = (0x7fffffffffffffff - lVar18) - (long)piVar27;
    lVar32 = (-0x8000000000000000 - lVar18) - (ulong)(uVar26 != 0);
    lVar17 = (long)piVar27 - lVar32;
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)piVar27) != SBORROW8(lVar14,uVar12)) ==
             (long)(lVar14 - uVar12) < 0;
    if (lVar18 < 0) {
      bVar42 = (SBORROW8((long)piVar27,lVar32) != SBORROW8(lVar17,(ulong)(uVar16 < -uVar26))) ==
               (long)(lVar17 - (ulong)(uVar16 < -uVar26)) < 0;
    }
    piVar22 = (int64_t *)(ulong)bVar42;
    a_01 = piStack_170;
    piVar41 = piStack_168;
    psStack_1c8 = psVar23;
    if (bVar42 == false) goto LAB_00147674;
    uVar12 = uVar7 + uVar4 >> 0x3e | lVar40 * 4;
    uVar7 = uVar16 + uVar26;
    piVar27 = (int64_t *)((long)piVar27 + (ulong)CARRY8(uVar16,uVar26) + lVar18);
    uVar4 = uStack_1e8 * (long)piStack_170 + uVar12;
    lVar18 = SUB168(SEXT816((long)uStack_1e8) * SEXT816((long)piStack_170),8) + (lVar40 >> 0x3e) +
             (ulong)CARRY8(uStack_1e8 * (long)piStack_170,uVar12);
    uVar26 = (long)piStack_1e0 * (long)piStack_168;
    lVar17 = SUB168(SEXT816((long)piStack_1e0) * SEXT816((long)piStack_168),8);
    uVar12 = (ulong)(-uVar26 - 1 < uVar4);
    lVar40 = (0x7fffffffffffffff - lVar17) - lVar18;
    lVar32 = (-0x8000000000000000 - lVar17) - (ulong)(uVar26 != 0);
    lVar14 = lVar18 - lVar32;
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar17,lVar18) != SBORROW8(lVar40,uVar12)) ==
             (long)(lVar40 - uVar12) < 0;
    if (lVar17 < 0) {
      bVar42 = (SBORROW8(lVar18,lVar32) != SBORROW8(lVar14,(ulong)(uVar4 < -uVar26))) ==
               (long)(lVar14 - (ulong)(uVar4 < -uVar26)) < 0;
    }
    piVar22 = (int64_t *)(ulong)bVar42;
    if (bVar42 == false) goto LAB_00147679;
    a_01 = (int64_t *)0x7fffffffffffffff;
    uVar12 = uVar4 + uVar26;
    lVar14 = lVar18 + lVar17 + (ulong)CARRY8(uVar4,uVar26);
    lVar40 = psVar11->v[1];
    if (lVar40 != 0) {
      uVar4 = lVar40 * lStack_1c0;
      lVar18 = SUB168(SEXT816(lVar40) * SEXT816(lStack_1c0),8);
      uVar26 = (ulong)(-uVar4 - 1 < uVar7);
      lVar17 = (0x7fffffffffffffff - lVar18) - (long)piVar27;
      piVar22 = (int64_t *)((-0x8000000000000000 - lVar18) - (ulong)(uVar4 != 0));
      bVar42 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)piVar27) != SBORROW8(lVar17,uVar26)) ==
               (long)(lVar17 - uVar26) < 0;
      if (lVar18 < 0) {
        bVar42 = (SBORROW8((long)piVar27,(long)piVar22) !=
                 SBORROW8((long)piVar27 - (long)piVar22,(ulong)(uVar7 < -uVar4))) ==
                 (long)(((long)piVar27 - (long)piVar22) - (ulong)(uVar7 < -uVar4)) < 0;
      }
      psVar13 = psVar23;
      piVar34 = piStack_168;
      if (!bVar42) goto LAB_001476c4;
      uVar16 = lVar40 * (long)psVar23;
      lVar32 = SUB168(SEXT816(lVar40) * SEXT816((long)psVar23),8);
      uVar26 = (ulong)(-uVar16 - 1 < uVar12);
      lVar40 = (0x7fffffffffffffff - lVar32) - lVar14;
      lVar38 = (-0x8000000000000000 - lVar32) - (ulong)(uVar16 != 0);
      lVar17 = lVar14 - lVar38;
      piVar34 = (int64_t *)(lVar17 - (ulong)(uVar12 < -uVar16));
      bVar42 = (SBORROW8(0x7fffffffffffffff - lVar32,lVar14) != SBORROW8(lVar40,uVar26)) ==
               (long)(lVar40 - uVar26) < 0;
      if (lVar32 < 0) {
        bVar42 = (SBORROW8(lVar14,lVar38) != SBORROW8(lVar17,(ulong)(uVar12 < -uVar16))) ==
                 (long)piVar34 < 0;
      }
      piVar22 = (int64_t *)(ulong)bVar42;
      if (bVar42 != false) {
        bVar42 = CARRY8(uVar7,uVar4);
        uVar7 = uVar7 + uVar4;
        piVar27 = (int64_t *)((long)piVar27 + (ulong)bVar42 + lVar18);
        bVar42 = CARRY8(uVar12,uVar16);
        uVar12 = uVar12 + uVar16;
        lVar14 = lVar14 + lVar32 + (ulong)bVar42;
        goto LAB_00146f98;
      }
      goto LAB_001476c9;
    }
LAB_00146f98:
    uVar26 = (long)piVar27 << 2 | uVar7 >> 0x3e;
    uVar16 = uStack_1d8 * (long)psStack_180 + uVar26;
    piVar27 = (int64_t *)
              (((long)piVar27 >> 0x3e) +
               SUB168(SEXT816((long)uStack_1d8) * SEXT816((long)psStack_180),8) +
              (ulong)CARRY8(uStack_1d8 * (long)psStack_180,uVar26));
    uVar4 = (long)piStack_1d0 * lStack_178;
    lVar18 = SUB168(SEXT816((long)piStack_1d0) * SEXT816(lStack_178),8);
    uVar26 = (ulong)(-uVar4 - 1 < uVar16);
    lVar40 = (0x7fffffffffffffff - lVar18) - (long)piVar27;
    lVar32 = (-0x8000000000000000 - lVar18) - (ulong)(uVar4 != 0);
    lVar17 = (long)piVar27 - lVar32;
    *piStack_1b0 = uVar7 & 0x3fffffffffffffff;
    *a_00 = uVar12 & 0x3fffffffffffffff;
    bVar42 = (SBORROW8((long)piVar27,lVar32) != SBORROW8(lVar17,(ulong)(uVar16 < -uVar4))) ==
             (long)(lVar17 - (ulong)(uVar16 < -uVar4)) < 0;
    piVar22 = (int64_t *)(ulong)bVar42;
    bVar1 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)piVar27) != SBORROW8(lVar40,uVar26)) ==
            (long)(lVar40 - uVar26) < 0;
    if (lVar18 < 0) {
      bVar1 = bVar42;
    }
    psVar13 = psStack_180;
    piVar41 = piStack_1b0;
    if (!bVar1) goto LAB_0014767e;
    uVar12 = uVar12 >> 0x3e | lVar14 << 2;
    uVar29 = uVar16 + uVar4;
    piVar27 = (int64_t *)((long)piVar27 + (ulong)CARRY8(uVar16,uVar4) + lVar18);
    uVar7 = uStack_1e8 * (long)psStack_180 + uVar12;
    lVar17 = SUB168(SEXT816((long)uStack_1e8) * SEXT816((long)psStack_180),8) + (lVar14 >> 0x3e) +
             (ulong)CARRY8(uStack_1e8 * (long)psStack_180,uVar12);
    uVar26 = (long)piStack_1e0 * lStack_178;
    lVar14 = SUB168(SEXT816((long)piStack_1e0) * SEXT816(lStack_178),8);
    uVar12 = (ulong)(-uVar26 - 1 < uVar7);
    lVar40 = (0x7fffffffffffffff - lVar14) - lVar17;
    psVar13 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    psVar24 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar14) - (ulong)(uVar26 != 0))
    ;
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar17) != SBORROW8(lVar40,uVar12)) ==
             (long)(lVar40 - uVar12) < 0;
    if (lVar14 < 0) {
      bVar42 = (SBORROW8(lVar17,(long)psVar24) !=
               SBORROW8(lVar17 - (long)psVar24,(ulong)(uVar7 < -uVar26))) ==
               (long)((lVar17 - (long)psVar24) - (ulong)(uVar7 < -uVar26)) < 0;
    }
    piVar22 = (int64_t *)(ulong)bVar42;
    if (bVar42 == false) goto LAB_00147683;
    uVar12 = uVar7 + uVar26;
    lVar14 = lVar17 + lVar14 + (ulong)CARRY8(uVar7,uVar26);
    lVar40 = psVar11->v[2];
    if (lVar40 != 0) {
      uVar7 = lVar40 * lStack_1c0;
      lVar18 = SUB168(SEXT816(lVar40) * SEXT816(lStack_1c0),8);
      uVar26 = (ulong)(-uVar7 - 1 < uVar29);
      lVar17 = (0x7fffffffffffffff - lVar18) - (long)piVar27;
      piVar22 = (int64_t *)((-0x8000000000000000 - lVar18) - (ulong)(uVar7 != 0));
      bVar42 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)piVar27) != SBORROW8(lVar17,uVar26)) ==
               (long)(lVar17 - uVar26) < 0;
      if (lVar18 < 0) {
        bVar42 = (SBORROW8((long)piVar27,(long)piVar22) !=
                 SBORROW8((long)piVar27 - (long)piVar22,(ulong)(uVar29 < -uVar7))) ==
                 (long)(((long)piVar27 - (long)piVar22) - (ulong)(uVar29 < -uVar7)) < 0;
      }
      piVar34 = piStack_1b0;
      if (!bVar42) goto LAB_001476ce;
      uVar4 = lVar40 * (long)psVar23;
      lVar32 = SUB168(SEXT816(lVar40) * SEXT816((long)psVar23),8);
      uVar26 = (ulong)(-uVar4 - 1 < uVar12);
      lVar40 = (0x7fffffffffffffff - lVar32) - lVar14;
      lVar38 = (-0x8000000000000000 - lVar32) - (ulong)(uVar4 != 0);
      lVar17 = lVar14 - lVar38;
      piVar34 = (int64_t *)
                (ulong)((SBORROW8(lVar14,lVar38) != SBORROW8(lVar17,(ulong)(uVar12 < -uVar4))) ==
                       (long)(lVar17 - (ulong)(uVar12 < -uVar4)) < 0);
      piVar22 = (int64_t *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar32,lVar14) != SBORROW8(lVar40,uVar26)) ==
                       (long)(lVar40 - uVar26) < 0);
      if (lVar32 < 0) {
        piVar22 = piVar34;
      }
      if ((char)piVar22 != '\0') {
        bVar42 = CARRY8(uVar29,uVar7);
        uVar29 = uVar29 + uVar7;
        piVar27 = (int64_t *)((long)piVar27 + (ulong)bVar42 + lVar18);
        bVar42 = CARRY8(uVar12,uVar4);
        uVar12 = uVar12 + uVar4;
        lVar14 = lVar14 + lVar32 + (ulong)bVar42;
        goto LAB_00147192;
      }
      goto LAB_001476d3;
    }
LAB_00147192:
    a_01 = (int64_t *)0x8000000000000000;
    psVar24 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar26 = (long)piVar27 << 2 | uVar29 >> 0x3e;
    uVar4 = uStack_1d8 * lStack_1a0 + uVar26;
    piVar27 = (int64_t *)
              (((long)piVar27 >> 0x3e) + SUB168(SEXT816((long)uStack_1d8) * SEXT816(lStack_1a0),8) +
              (ulong)CARRY8(uStack_1d8 * lStack_1a0,uVar26));
    uVar7 = (long)piStack_1d0 * (long)psStack_188;
    lVar18 = SUB168(SEXT816((long)piStack_1d0) * SEXT816((long)psStack_188),8);
    uVar26 = (ulong)(-uVar7 - 1 < uVar4);
    lVar40 = (0x7fffffffffffffff - lVar18) - (long)piVar27;
    lVar32 = (-0x8000000000000000 - lVar18) - (ulong)(uVar7 != 0);
    lVar17 = (long)piVar27 - lVar32;
    piStack_1b0[1] = uVar29 & 0x3fffffffffffffff;
    a_00[1] = uVar12 & 0x3fffffffffffffff;
    bVar42 = (SBORROW8((long)piVar27,lVar32) != SBORROW8(lVar17,(ulong)(uVar4 < -uVar7))) ==
             (long)(lVar17 - (ulong)(uVar4 < -uVar7)) < 0;
    piVar22 = (int64_t *)(ulong)bVar42;
    bVar1 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)piVar27) != SBORROW8(lVar40,uVar26)) ==
            (long)(lVar40 - uVar26) < 0;
    if (lVar18 < 0) {
      bVar1 = bVar42;
    }
    psVar13 = psStack_188;
    if (!bVar1) goto LAB_00147688;
    uVar12 = uVar12 >> 0x3e | lVar14 << 2;
    uVar16 = uVar4 + uVar7;
    piVar27 = (int64_t *)((long)piVar27 + (ulong)CARRY8(uVar4,uVar7) + lVar18);
    uVar7 = uStack_1e8 * lStack_1a0 + uVar12;
    lVar17 = SUB168(SEXT816((long)uStack_1e8) * SEXT816(lStack_1a0),8) + (lVar14 >> 0x3e) +
             (ulong)CARRY8(uStack_1e8 * lStack_1a0,uVar12);
    uVar26 = (long)piStack_1e0 * (long)psStack_188;
    lVar14 = SUB168(SEXT816((long)piStack_1e0) * SEXT816((long)psStack_188),8);
    uVar12 = (ulong)(-uVar26 - 1 < uVar7);
    lVar40 = (0x7fffffffffffffff - lVar14) - lVar17;
    psVar24 = (secp256k1_modinv64_signed62 *)(lVar40 - uVar12);
    psVar13 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    a_01 = (int64_t *)((-0x8000000000000000 - lVar14) - (ulong)(uVar26 != 0));
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar17) != SBORROW8(lVar40,uVar12)) ==
             (long)psVar24 < 0;
    if (lVar14 < 0) {
      bVar42 = (SBORROW8(lVar17,(long)a_01) !=
               SBORROW8(lVar17 - (long)a_01,(ulong)(uVar7 < -uVar26))) ==
               (long)((lVar17 - (long)a_01) - (ulong)(uVar7 < -uVar26)) < 0;
    }
    piVar22 = (int64_t *)(ulong)bVar42;
    if (bVar42 == false) goto LAB_0014768d;
    uVar12 = uVar7 + uVar26;
    lVar14 = lVar17 + lVar14 + (ulong)CARRY8(uVar7,uVar26);
    lVar40 = psVar11->v[3];
    if (lVar40 == 0) {
LAB_00147375:
      a_01 = (int64_t *)0x8000000000000000;
      uVar26 = (long)piVar27 << 2 | uVar16 >> 0x3e;
      uVar4 = uStack_1d8 * (long)psStack_190 + uVar26;
      piVar27 = (int64_t *)
                (((long)piVar27 >> 0x3e) +
                 SUB168(SEXT816((long)uStack_1d8) * SEXT816((long)psStack_190),8) +
                (ulong)CARRY8(uStack_1d8 * (long)psStack_190,uVar26));
      uVar7 = (long)piStack_1d0 * (long)psStack_198;
      lVar18 = SUB168(SEXT816((long)piStack_1d0) * SEXT816((long)psStack_198),8);
      uVar26 = (ulong)(-uVar7 - 1 < uVar4);
      lVar40 = (0x7fffffffffffffff - lVar18) - (long)piVar27;
      lVar32 = (-0x8000000000000000 - lVar18) - (ulong)(uVar7 != 0);
      lVar17 = (long)piVar27 - lVar32;
      piStack_1b0[2] = uVar16 & 0x3fffffffffffffff;
      a_00[2] = uVar12 & 0x3fffffffffffffff;
      bVar42 = (SBORROW8((long)piVar27,lVar32) != SBORROW8(lVar17,(ulong)(uVar4 < -uVar7))) ==
               (long)(lVar17 - (ulong)(uVar4 < -uVar7)) < 0;
      piVar22 = (int64_t *)(ulong)bVar42;
      bVar1 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)piVar27) != SBORROW8(lVar40,uVar26)) ==
              (long)(lVar40 - uVar26) < 0;
      if (lVar18 < 0) {
        bVar1 = bVar42;
      }
      psVar13 = psStack_198;
      psVar24 = psStack_190;
      if (!bVar1) goto LAB_00147692;
      uVar12 = uVar12 >> 0x3e | lVar14 << 2;
      uVar16 = uVar4 + uVar7;
      piVar27 = (int64_t *)((long)piVar27 + (ulong)CARRY8(uVar4,uVar7) + lVar18);
      uVar7 = uStack_1e8 * (long)psStack_190 + uVar12;
      lVar18 = SUB168(SEXT816((long)uStack_1e8) * SEXT816((long)psStack_190),8) + (lVar14 >> 0x3e) +
               (ulong)CARRY8(uStack_1e8 * (long)psStack_190,uVar12);
      uVar26 = (long)piStack_1e0 * (long)psStack_198;
      lVar17 = SUB168(SEXT816((long)piStack_1e0) * SEXT816((long)psStack_198),8);
      uVar12 = (ulong)(-uVar26 - 1 < uVar7);
      lVar40 = (0x7fffffffffffffff - lVar17) - lVar18;
      lVar32 = (-0x8000000000000000 - lVar17) - (ulong)(uVar26 != 0);
      lVar14 = lVar18 - lVar32;
      bVar42 = (SBORROW8(0x7fffffffffffffff - lVar17,lVar18) != SBORROW8(lVar40,uVar12)) ==
               (long)(lVar40 - uVar12) < 0;
      if (lVar17 < 0) {
        bVar42 = (SBORROW8(lVar18,lVar32) != SBORROW8(lVar14,(ulong)(uVar7 < -uVar26))) ==
                 (long)(lVar14 - (ulong)(uVar7 < -uVar26)) < 0;
      }
      piVar22 = (int64_t *)(ulong)bVar42;
      if (bVar42 == false) goto LAB_00147697;
      uVar4 = uVar7 + uVar26;
      lVar17 = lVar18 + lVar17 + (ulong)CARRY8(uVar7,uVar26);
      lVar40 = psVar11->v[4];
      uVar26 = lVar40 * lStack_1c0;
      piVar22 = SUB168(SEXT816(lVar40) * SEXT816(lStack_1c0),8);
      uVar12 = (ulong)(-uVar26 - 1 < uVar16);
      lVar14 = (0x7fffffffffffffff - (long)piVar22) - (long)piVar27;
      piVar41 = (int64_t *)((-0x8000000000000000 - (long)piVar22) - (ulong)(uVar26 != 0));
      bVar42 = (SBORROW8(0x7fffffffffffffff - (long)piVar22,(long)piVar27) !=
               SBORROW8(lVar14,uVar12)) == (long)(lVar14 - uVar12) < 0;
      if ((long)piVar22 < 0) {
        bVar42 = (SBORROW8((long)piVar27,(long)piVar41) !=
                 SBORROW8((long)piVar27 - (long)piVar41,(ulong)(uVar16 < -uVar26))) ==
                 (long)(((long)piVar27 - (long)piVar41) - (ulong)(uVar16 < -uVar26)) < 0;
      }
      if (!bVar42) goto LAB_0014769c;
      uVar7 = lVar40 * (long)psVar23;
      lVar14 = SUB168(SEXT816(lVar40) * SEXT816((long)psVar23),8);
      psVar24 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
      uVar12 = (ulong)(-uVar7 - 1 < uVar4);
      lVar40 = (0x7fffffffffffffff - lVar14) - lVar17;
      a_01 = (int64_t *)((-0x8000000000000000 - lVar14) - (ulong)(uVar7 != 0));
      bVar42 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar17) != SBORROW8(lVar40,uVar12)) ==
               (long)(lVar40 - uVar12) < 0;
      if (lVar14 < 0) {
        bVar42 = (SBORROW8(lVar17,(long)a_01) !=
                 SBORROW8(lVar17 - (long)a_01,(ulong)(uVar4 < -uVar7))) ==
                 (long)((lVar17 - (long)a_01) - (ulong)(uVar4 < -uVar7)) < 0;
      }
      psVar13 = (secp256k1_modinv64_signed62 *)(ulong)bVar42;
      if (bVar42 == false) goto LAB_001476a1;
      lVar18 = (long)piVar22 + (long)piVar27 + (ulong)CARRY8(uVar26,uVar16);
      lVar40 = lVar14 + lVar17 + (ulong)CARRY8(uVar7,uVar4);
      psVar13 = (secp256k1_modinv64_signed62 *)(lVar18 * 4 | uVar26 + uVar16 >> 0x3e);
      piStack_1b0[3] = uVar26 + uVar16 & 0x3fffffffffffffff;
      a_00[3] = uVar7 + uVar4 & 0x3fffffffffffffff;
      piVar27 = psVar13[0x333333333333332].v + 4;
      piVar22 = (int64_t *)
                ((lVar18 >> 0x3e) + -1 +
                (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar13));
      if (piVar22 != (int64_t *)0xffffffffffffffff) goto LAB_001476a6;
      piVar22 = (int64_t *)0xffffffffffffffff;
      uVar12 = uVar7 + uVar4 >> 0x3e | lVar40 * 4;
      piStack_1b0[4] = (int64_t)psVar13;
      psVar24 = (secp256k1_modinv64_signed62 *)(uVar12 + 0x8000000000000000);
      if ((lVar40 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar12) != -1) goto LAB_001476ab;
      a_00[4] = uVar12;
      piVar22 = (int64_t *)0x5;
      psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
      piStack_1f0 = (int64_t *)0x1475c5;
      piVar27 = piStack_1b0;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piStack_1b0,5,psVar11,-2)
      ;
      if (iVar2 < 1) goto LAB_001476b0;
      psVar13 = (secp256k1_modinv64_signed62 *)0x1;
      piVar22 = (int64_t *)0x5;
      piStack_1f0 = (int64_t *)0x1475e2;
      piVar27 = piVar39;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piVar39,5,psVar11,1);
      if (-1 < iVar2) goto LAB_001476b5;
      piVar22 = (int64_t *)0x5;
      psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
      piStack_1f0 = (int64_t *)0x147601;
      piVar27 = a_00;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,psVar11,-2);
      if (iVar2 < 1) goto LAB_001476ba;
      psVar13 = (secp256k1_modinv64_signed62 *)0x1;
      piVar22 = (int64_t *)0x5;
      piStack_1f0 = (int64_t *)0x14761e;
      piVar27 = a_00;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,psVar11,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_001476bf;
    }
    psVar24 = (secp256k1_modinv64_signed62 *)(lVar40 * lStack_1c0);
    lVar18 = SUB168(SEXT816(lVar40) * SEXT816(lStack_1c0),8);
    uVar26 = (ulong)(-(long)psVar24 - 1U < uVar16);
    lVar17 = (0x7fffffffffffffff - lVar18) - (long)piVar27;
    a_01 = (int64_t *)0x8000000000000000;
    piVar22 = (int64_t *)
              ((-0x8000000000000000 - lVar18) -
              (ulong)(psVar24 != (secp256k1_modinv64_signed62 *)0x0));
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)piVar27) != SBORROW8(lVar17,uVar26)) ==
             (long)(lVar17 - uVar26) < 0;
    if (lVar18 < 0) {
      bVar42 = (SBORROW8((long)piVar27,(long)piVar22) !=
               SBORROW8((long)piVar27 - (long)piVar22,(ulong)(uVar16 < (ulong)-(long)psVar24))) ==
               (long)(((long)piVar27 - (long)piVar22) - (ulong)(uVar16 < (ulong)-(long)psVar24)) < 0
      ;
    }
    piVar34 = piStack_1b0;
    if (!bVar42) goto LAB_001476d8;
    uVar7 = lVar40 * (long)psVar23;
    lVar32 = SUB168(SEXT816(lVar40) * SEXT816((long)psVar23),8);
    uVar26 = (ulong)(-uVar7 - 1 < uVar12);
    lVar40 = (0x7fffffffffffffff - lVar32) - lVar14;
    lVar38 = (-0x8000000000000000 - lVar32) - (ulong)(uVar7 != 0);
    lVar17 = lVar14 - lVar38;
    piVar34 = (int64_t *)(lVar17 - (ulong)(uVar12 < -uVar7));
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar32,lVar14) != SBORROW8(lVar40,uVar26)) ==
             (long)(lVar40 - uVar26) < 0;
    if (lVar32 < 0) {
      bVar42 = (SBORROW8(lVar14,lVar38) != SBORROW8(lVar17,(ulong)(uVar12 < -uVar7))) ==
               (long)piVar34 < 0;
    }
    uVar15 = (uint)bVar42;
    if (bVar42 != false) {
      bVar42 = CARRY8(uVar16,(ulong)psVar24);
      uVar16 = (long)psVar24->v + uVar16;
      piVar27 = (int64_t *)((long)piVar27 + (ulong)bVar42 + lVar18);
      bVar42 = CARRY8(uVar12,uVar7);
      uVar12 = uVar12 + uVar7;
      lVar14 = lVar14 + lVar32 + (ulong)bVar42;
      goto LAB_00147375;
    }
  }
  piStack_1f0 = (int64_t *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  psVar13 = &sStack_250;
  psStack_200 = psVar24;
  piStack_1f8 = a_01;
  piStack_1f0 = piVar34;
  secp256k1_modinv64_mul_62(&sStack_228,(secp256k1_modinv64_signed62 *)piVar27,uVar15,1);
  psVar11 = a;
  secp256k1_modinv64_mul_62(&sStack_250,a,5,(int64_t)psVar23);
  lVar40 = 0;
  while ((ulong)sStack_228.v[lVar40] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_250.v[lVar40]) goto LAB_00147772;
    lVar40 = lVar40 + 1;
    if (lVar40 == 4) {
      uVar15 = 4;
      while( true ) {
        if (sStack_228.v[uVar15] < sStack_250.v[uVar15]) {
          return;
        }
        if (sStack_250.v[uVar15] < sStack_228.v[uVar15]) break;
        bVar42 = uVar15 == 0;
        uVar15 = uVar15 - 1;
        if (bVar42) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00147772:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar2 = (int)psVar13;
  if (iVar2 < 1) {
LAB_00147a31:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00147a36:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00147a3b:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00147a40:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_00147a45:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00147a4a:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar40 = psVar23->v[0];
    lVar14 = psVar23->v[1];
    lVar17 = psVar11->v[0];
    lVar18 = *extraout_RDX_00;
    uVar12 = lVar17 * lVar40;
    lVar38 = SUB168(SEXT816(lVar17) * SEXT816(lVar40),8);
    uVar26 = lVar18 * lVar14;
    lVar19 = SUB168(SEXT816(lVar18) * SEXT816(lVar14),8);
    lVar32 = (0x7fffffffffffffff - lVar19) - lVar38;
    if (-1 < lVar19 &&
        (SBORROW8(0x7fffffffffffffff - lVar19,lVar38) != SBORROW8(lVar32,(ulong)(~uVar26 < uVar12)))
        != (long)(lVar32 - (ulong)(~uVar26 < uVar12)) < 0) goto LAB_00147a36;
    lVar32 = psVar23->v[2];
    lVar30 = lVar19 + lVar38 + (ulong)CARRY8(uVar26,uVar12);
    lVar38 = psVar23->v[3];
    uVar4 = lVar17 * lVar32;
    lVar19 = SUB168(SEXT816(lVar17) * SEXT816(lVar32),8);
    uVar16 = lVar18 * lVar38;
    lVar18 = SUB168(SEXT816(lVar18) * SEXT816(lVar38),8);
    uVar7 = (ulong)(-uVar16 - 1 < uVar4);
    lVar17 = (0x7fffffffffffffff - lVar18) - lVar19;
    if (-1 < lVar18 &&
        (SBORROW8(0x7fffffffffffffff - lVar18,lVar19) != SBORROW8(lVar17,uVar7)) !=
        (long)(lVar17 - uVar7) < 0) goto LAB_00147a3b;
    lVar17 = lVar18 + lVar19 + (ulong)CARRY8(uVar16,uVar4);
    if ((uVar26 + uVar12 & 0x3fffffffffffffff) != 0) goto LAB_00147a40;
    if ((uVar16 + uVar4 & 0x3fffffffffffffff) != 0) goto LAB_00147a45;
    uVar7 = uVar16 + uVar4 >> 0x3e | lVar17 * 4;
    uVar12 = uVar26 + uVar12 >> 0x3e | lVar30 * 4;
    lVar17 = lVar17 >> 0x3e;
    lVar30 = lVar30 >> 0x3e;
    if (iVar2 != 1) {
      psVar23 = (secp256k1_modinv64_signed62 *)((ulong)psVar13 & 0xffffffff);
      psVar13 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar18 = psVar11->v[(long)psVar13];
        uVar4 = lVar18 * lVar40 + uVar12;
        lVar25 = SUB168(SEXT816(lVar18) * SEXT816(lVar40),8) + lVar30 +
                 (ulong)CARRY8(lVar18 * lVar40,uVar12);
        lVar19 = extraout_RDX_00[(long)psVar13];
        uVar26 = lVar19 * lVar14;
        lVar20 = SUB168(SEXT816(lVar19) * SEXT816(lVar14),8);
        uVar12 = (ulong)(-uVar26 - 1 < uVar4);
        lVar30 = (0x7fffffffffffffff - lVar20) - lVar25;
        psVar24 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar35 = (-0x8000000000000000 - lVar20) - (ulong)(uVar26 != 0);
        lVar36 = lVar25 - lVar35;
        bVar42 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar25) != SBORROW8(lVar30,uVar12)) ==
                 (long)(lVar30 - uVar12) < 0;
        if (lVar20 < 0) {
          bVar42 = (SBORROW8(lVar25,lVar35) != SBORROW8(lVar36,(ulong)(uVar4 < -uVar26))) ==
                   (long)(lVar36 - (ulong)(uVar4 < -uVar26)) < 0;
        }
        if (!bVar42) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00147a2c:
          psVar11 = psVar24;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_00147a31;
        }
        uVar29 = lVar18 * lVar32 + uVar7;
        lVar36 = SUB168(SEXT816(lVar18) * SEXT816(lVar32),8) + lVar17 +
                 (ulong)CARRY8(lVar18 * lVar32,uVar7);
        uVar16 = lVar19 * lVar38;
        lVar19 = SUB168(SEXT816(lVar19) * SEXT816(lVar38),8);
        uVar12 = (ulong)(-uVar16 - 1 < uVar29);
        lVar17 = (0x7fffffffffffffff - lVar19) - lVar36;
        lVar30 = (-0x8000000000000000 - lVar19) - (ulong)(uVar16 != 0);
        lVar18 = lVar36 - lVar30;
        bVar42 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar36) != SBORROW8(lVar17,uVar12)) ==
                 (long)(lVar17 - uVar12) < 0;
        if (lVar19 < 0) {
          bVar42 = (SBORROW8(lVar36,lVar30) != SBORROW8(lVar18,(ulong)(uVar29 < -uVar16))) ==
                   (long)(lVar18 - (ulong)(uVar29 < -uVar16)) < 0;
        }
        if (!bVar42) goto LAB_00147a2c;
        lVar30 = lVar20 + lVar25 + (ulong)CARRY8(uVar26,uVar4);
        lVar17 = lVar19 + lVar36 + (ulong)CARRY8(uVar16,uVar29);
        uVar12 = lVar30 * 4 | uVar26 + uVar4 >> 0x3e;
        psVar11->v[(long)((long)psVar13[-1].v + 0x27)] = uVar26 + uVar4 & 0x3fffffffffffffff;
        uVar7 = lVar17 * 4 | uVar16 + uVar29 >> 0x3e;
        extraout_RDX_00[(long)((long)psVar13[-1].v + 0x27)] = uVar16 + uVar29 & 0x3fffffffffffffff;
        psVar13 = (secp256k1_modinv64_signed62 *)((long)psVar13->v + 1);
        lVar17 = lVar17 >> 0x3e;
        lVar30 = lVar30 >> 0x3e;
      } while (psVar23 != psVar13);
    }
    if (lVar30 + -1 + (ulong)(0x7fffffffffffffff < uVar12) != -1) goto LAB_00147a4a;
    psVar11->v[(long)iVar2 + -1] = uVar12;
    if (lVar17 + -1 + (ulong)(0x7fffffffffffffff < uVar7) == -1) {
      extraout_RDX_00[(long)iVar2 + -1] = uVar7;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar40 = psVar13->v[0];
  lVar14 = psVar13->v[1];
  lVar17 = psVar13->v[2];
  lVar18 = psVar13->v[3];
  lVar32 = psVar13->v[4];
  lVar38 = 0;
  do {
    if (psVar13->v[lVar38] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00147c80:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00147c85;
    }
    if (0x3fffffffffffffff < psVar13->v[lVar38]) goto LAB_00147c80;
    lVar38 = lVar38 + 1;
  } while (lVar38 != 5);
  iVar2 = secp256k1_modinv64_mul_cmp_62(psVar13,5,b,-2);
  if (iVar2 < 1) {
LAB_00147c85:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00147c8a:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00147c8f:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar2 = secp256k1_modinv64_mul_cmp_62(psVar13,5,b,1);
    if (-1 < iVar2) goto LAB_00147c8a;
    uVar12 = lVar32 >> 0x3f;
    uVar4 = (long)psVar11 >> 0x3f;
    uVar26 = ((uVar12 & b->v[0]) + lVar40 ^ uVar4) - uVar4;
    uVar16 = ((long)uVar26 >> 0x3e) + (((uVar12 & b->v[1]) + lVar14 ^ uVar4) - uVar4);
    uVar29 = ((long)uVar16 >> 0x3e) + ((lVar17 + (uVar12 & b->v[2]) ^ uVar4) - uVar4);
    uVar7 = ((long)uVar29 >> 0x3e) + (((uVar12 & b->v[3]) + lVar18 ^ uVar4) - uVar4);
    lVar40 = ((long)uVar7 >> 0x3e) + (((uVar12 & b->v[4]) + lVar32 ^ uVar4) - uVar4);
    uVar4 = lVar40 >> 0x3f;
    uVar12 = (b->v[0] & uVar4) + (uVar26 & 0x3fffffffffffffff);
    uVar16 = ((long)uVar12 >> 0x3e) + (b->v[1] & uVar4) + (uVar16 & 0x3fffffffffffffff);
    uVar26 = ((long)uVar16 >> 0x3e) + (b->v[2] & uVar4) + (uVar29 & 0x3fffffffffffffff);
    uVar7 = ((long)uVar26 >> 0x3e) + (b->v[3] & uVar4) + (uVar7 & 0x3fffffffffffffff);
    uVar4 = (b->v[4] & uVar4) + lVar40 + ((long)uVar7 >> 0x3e);
    psVar13->v[0] = uVar12 & 0x3fffffffffffffff;
    psVar13->v[1] = uVar16 & 0x3fffffffffffffff;
    psVar13->v[2] = uVar26 & 0x3fffffffffffffff;
    psVar13->v[3] = uVar7 & 0x3fffffffffffffff;
    psVar13->v[4] = uVar4;
    if (0x3fffffffffffffff < uVar4) goto LAB_00147c8f;
    iVar2 = secp256k1_modinv64_mul_cmp_62(psVar13,5,b,0);
    if (-1 < iVar2) {
      iVar2 = secp256k1_modinv64_mul_cmp_62(psVar13,5,b,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_00147c99;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00147c99:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;

    /* Do iterations of 62 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 62 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_divsteps_62_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of g is zero, there is a chance that g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn ^ (fn >> 63);
        cond |= gn ^ (gn >> 63);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint64_t)fn << 62;
            g.v[len - 2] |= (uint64_t)gn << 62;
            --len;
        }
#ifdef VERIFY
        VERIFY_CHECK(++i < 12); /* We should never need more than 12*62 = 744 divsteps */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */
#ifdef VERIFY
    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  (secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) == 0)));
#endif

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[len - 1], modinfo);
    *x = d;
}